

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForTopFunction(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  byte scale;
  JITTimeFunctionBody *pJVar4;
  RegOpnd *baseOpnd;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  int iVar7;
  int iVar8;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar4);
  if (bVar2) {
    baseOpnd = LoadGeneratorArgsPtr(ldElem);
  }
  else {
    baseOpnd = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  }
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar4);
  if (bVar2) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::IsGenerator(pJVar4);
    iVar7 = 1;
    iVar8 = 1;
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5666,
                         "(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator())",
                         "actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator()");
      if (!bVar2) goto LAB_005e563e;
      *puVar5 = 0;
    }
  }
  else {
    iVar7 = 5;
    iVar8 = 5;
  }
  OVar3 = IR::Opnd::GetKind(valueOpnd);
  if (OVar3 == OpndKindIntConst) {
    OVar3 = IR::Opnd::GetKind(valueOpnd);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) {
LAB_005e563e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pIVar6 = IR::IndirOpnd::New(baseOpnd,(iVar7 + *(int *)&valueOpnd[1]._vptr_Opnd) * 8,TyInt64,
                                this->m_func,false);
    return pIVar6;
  }
  scale = LowererMDArch::GetDefaultIndirScale();
  OVar3 = IR::Opnd::GetKind(&baseOpnd->super_Opnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005e563e;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(valueOpnd);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_005e563e;
    *puVar5 = 0;
  }
  pIVar6 = IR::IndirOpnd::New(baseOpnd,(RegOpnd *)valueOpnd,scale,TyInt64,this->m_func);
  pIVar6->m_offset = iVar8 << (scale & 0x1f);
  (pIVar6->super_Opnd).field_0xe = 0;
  return pIVar6;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForTopFunction(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    // Load argument set dst = [ebp + index] (or grab from the generator object if m_func is a generator function).
    IR::RegOpnd *baseOpnd = m_func->GetJITFunctionBody()->IsCoroutine() ? LoadGeneratorArgsPtr(ldElem) : IR::Opnd::CreateFramePointerOpnd(m_func);
    IR::IndirOpnd* argIndirOpnd = nullptr;
    // The stack looks like this:
    //       ...
    //       arguments[1]
    //       arguments[0]
    //       this
    //       callinfo
    //       function object
    //       return addr
    // EBP-> EBP chain

    //actual arguments offset is LowererMD::GetFormalParamOffset() + 1 (this)

    uint16 actualOffset = m_func->GetJITFunctionBody()->IsCoroutine() ? 1 : GetFormalParamOffset() + 1; //5
    Assert(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator());
    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = (valueOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
    }
    else
    {
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd->AsRegOpnd(), valueOpnd->AsRegOpnd(), indirScale, TyMachReg, this->m_func);

        // Need to offset valueOpnd by 5. Instead of changing valueOpnd, we can just add an offset to the indir. Changing
        // valueOpnd requires creation of a temp sym (if it's not already a temp) so that the value of the sym that
        // valueOpnd represents is not changed.
        argIndirOpnd->SetOffset(actualOffset << indirScale);
    }
    return argIndirOpnd;
}